

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::LocalClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,LocalClient *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,CallHints hints
          )

{
  uint *puVar1;
  ClientHook *pCVar2;
  CapTableBuilder *pCVar3;
  Own<capnp::LocalRequest,_std::nullptr_t> OVar4;
  Builder root;
  uint16_t local_54;
  CallHints local_52;
  Builder local_50;
  Disposer *local_38;
  RequestHook *pRStack_30;
  uint64_t local_28;
  char local_20 [8];
  uint64_t local_18;
  undefined8 uStack_10;
  
  pCVar2 = (this->resolved).ptr.ptr;
  local_54 = methodId;
  local_52 = hints;
  local_28 = interfaceId;
  if (pCVar2 == (ClientHook *)0x0) {
    puVar1 = &(this->super_Refcounted).refcount;
    *puVar1 = *puVar1 + 1;
    local_50.builder.segment = (SegmentBuilder *)&this->super_Refcounted;
    local_50.builder.capTable = (CapTableBuilder *)this;
    OVar4 = kj::
            heap<capnp::LocalRequest,unsigned_long&,unsigned_short&,kj::Maybe<capnp::MessageSize>&,capnp::Capability::Client::CallHints&,kj::Own<capnp::LocalClient,decltype(nullptr)>>
                      ((kj *)&local_38,&local_28,&local_54,sizeHint,&local_52,
                       (Own<capnp::LocalClient,_std::nullptr_t> *)&local_50);
    pCVar3 = local_50.builder.capTable;
    if ((LocalClient *)local_50.builder.capTable != (LocalClient *)0x0) {
      local_50.builder.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_50.builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
                (local_50.builder.segment,
                 (_func_int *)
                 ((long)&((ClientHook *)&pCVar3->super_CapTableReader)->_vptr_ClientHook +
                 (long)((ClientHook *)&pCVar3->super_CapTableReader)->_vptr_ClientHook[-2]),
                 OVar4.ptr);
    }
    MessageBuilder::getRootInternal(&local_50,(MessageBuilder *)pRStack_30[1].brand);
    (__return_storage_ptr__->super_Builder).builder.pointer = local_50.builder.pointer;
    (__return_storage_ptr__->super_Builder).builder.segment = local_50.builder.segment;
    (__return_storage_ptr__->super_Builder).builder.capTable = local_50.builder.capTable;
    (__return_storage_ptr__->hook).disposer = local_38;
    (__return_storage_ptr__->hook).ptr = pRStack_30;
  }
  else {
    local_20[0] = (sizeHint->ptr).isSet;
    if ((bool)local_20[0] == true) {
      local_18 = (sizeHint->ptr).field_1.value.wordCount;
      uStack_10 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (**pCVar2->_vptr_ClientHook)(__return_storage_ptr__,pCVar2,interfaceId,(ulong)methodId,local_20)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
      CallHints hints) override {
    KJ_IF_SOME(r, resolved) {
      // We resolved to a shortened path. New calls MUST go directly to the replacement capability
      // so that their ordering is consistent with callers who call getResolved() to get direct
      // access to the new capability. In particular it's important that we don't place these calls
      // in our streaming queue.
      return r->newCall(interfaceId, methodId, sizeHint, hints);
    }

    auto hook = kj::heap<LocalRequest>(
        interfaceId, methodId, sizeHint, hints, kj::addRef(*this));
    auto root = hook->message->getRoot<AnyPointer>();
    return Request<AnyPointer, AnyPointer>(root, kj::mv(hook));
  }